

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void * vmd_stack_push(vmd_stack_t *set,void *data)

{
  int iVar1;
  vmd_stack_block_t *pvVar2;
  vmd_stack_block_t *pvVar3;
  void *pvVar4;
  
  pvVar2 = set->head;
  if ((pvVar2 == (vmd_stack_block_t *)0x0) || (pvVar2->used == 0x400)) {
    pvVar3 = (vmd_stack_block_t *)malloc(set->dsize << 10 | 0x10);
    pvVar3->next = pvVar2;
    pvVar3->used = 0;
    set->head = pvVar3;
  }
  pvVar2 = set->head;
  iVar1 = pvVar2->used;
  pvVar2->used = iVar1 + 1;
  if (data != (void *)0x0) {
    pvVar4 = memcpy(&pvVar2->field_0xc + (long)iVar1 * set->dsize,data,set->dsize);
    return pvVar4;
  }
  return &pvVar2->field_0xc + (long)iVar1 * set->dsize;
}

Assistant:

void *
stack_push(stack_t *set, const void *data)
{
	if (set->head == NULL || set->head->used == BLOCK_SIZE) {
		stack_block_t *head = malloc(sizeof(stack_block_t) + set->dsize * BLOCK_SIZE);

		head->next = set->head;
		head->used = 0;

		set->head = head;
	}

	void *ret = set->head->data + (set->head->used++) * set->dsize;
	if (data)
		memcpy(ret, data, set->dsize);
	return ret;
}